

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerators::StartsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *with_local;
  string *str_local;
  cmQtAutoGenerators *this_local;
  
  local_20 = with;
  with_local = str;
  str_local = &this->QtMajorVersion;
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_40,(ulong)str);
  _Var1 = std::operator==(&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return _Var1;
}

Assistant:

bool cmQtAutoGenerators::StartsWith(const std::string& str,
                                    const std::string& with)
{
  return (str.substr(0, with.length()) == with);
}